

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

void MD5Transform(UINT4 *state,uchar *block)

{
  UINT4 UVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  UINT4 local_68;
  int local_64;
  UINT4 x [16];
  UINT4 d;
  UINT4 c;
  UINT4 b;
  UINT4 a;
  uchar *block_local;
  UINT4 *state_local;
  
  UVar1 = *state;
  uVar5 = state[1];
  x[0xf] = state[2];
  x[0xe] = state[3];
  Decode(&local_68,block,0x40);
  uVar2 = (uVar5 & x[0xf] | (uVar5 ^ 0xffffffff) & x[0xe]) + local_68 + -0x28955b88 + UVar1;
  uVar3 = uVar5 + (uVar2 * 0x80 | uVar2 >> 0x19);
  uVar2 = (uVar3 & uVar5 | (uVar3 ^ 0xffffffff) & x[0xf]) + local_64 + -0x173848aa + x[0xe];
  uVar4 = uVar3 + (uVar2 * 0x1000 | uVar2 >> 0x14);
  uVar2 = (uVar4 & uVar3 | (uVar4 ^ 0xffffffff) & uVar5) + x[0] + 0x242070db + x[0xf];
  uVar2 = uVar4 + (uVar2 * 0x20000 | uVar2 >> 0xf);
  uVar5 = (uVar2 & uVar4 | (uVar2 ^ 0xffffffff) & uVar3) + x[1] + -0x3e423112 + uVar5;
  uVar5 = uVar2 + (uVar5 * 0x400000 | uVar5 >> 10);
  uVar3 = (uVar5 & uVar2 | (uVar5 ^ 0xffffffff) & uVar4) + x[2] + -0xa83f051 + uVar3;
  uVar3 = uVar5 + (uVar3 * 0x80 | uVar3 >> 0x19);
  uVar4 = (uVar3 & uVar5 | (uVar3 ^ 0xffffffff) & uVar2) + x[3] + 0x4787c62a + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x1000 | uVar4 >> 0x14);
  uVar2 = (uVar4 & uVar3 | (uVar4 ^ 0xffffffff) & uVar5) + x[4] + -0x57cfb9ed + uVar2;
  uVar2 = uVar4 + (uVar2 * 0x20000 | uVar2 >> 0xf);
  uVar5 = (uVar2 & uVar4 | (uVar2 ^ 0xffffffff) & uVar3) + x[5] + -0x2b96aff + uVar5;
  uVar5 = uVar2 + (uVar5 * 0x400000 | uVar5 >> 10);
  uVar3 = (uVar5 & uVar2 | (uVar5 ^ 0xffffffff) & uVar4) + x[6] + 0x698098d8 + uVar3;
  uVar3 = uVar5 + (uVar3 * 0x80 | uVar3 >> 0x19);
  uVar4 = (uVar3 & uVar5 | (uVar3 ^ 0xffffffff) & uVar2) + x[7] + -0x74bb0851 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x1000 | uVar4 >> 0x14);
  uVar2 = (uVar4 & uVar3 | (uVar4 ^ 0xffffffff) & uVar5) + x[8] + -0xa44f + uVar2;
  uVar2 = uVar4 + (uVar2 * 0x20000 | uVar2 >> 0xf);
  uVar5 = (uVar2 & uVar4 | (uVar2 ^ 0xffffffff) & uVar3) + x[9] + -0x76a32842 + uVar5;
  uVar5 = uVar2 + (uVar5 * 0x400000 | uVar5 >> 10);
  uVar3 = (uVar5 & uVar2 | (uVar5 ^ 0xffffffff) & uVar4) + x[10] + 0x6b901122 + uVar3;
  uVar3 = uVar5 + (uVar3 * 0x80 | uVar3 >> 0x19);
  uVar4 = (uVar3 & uVar5 | (uVar3 ^ 0xffffffff) & uVar2) + x[0xb] + -0x2678e6d + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x1000 | uVar4 >> 0x14);
  uVar2 = (uVar4 & uVar3 | (uVar4 ^ 0xffffffff) & uVar5) + x[0xc] + -0x5986bc72 + uVar2;
  uVar2 = uVar4 + (uVar2 * 0x20000 | uVar2 >> 0xf);
  uVar5 = (uVar2 & uVar4 | (uVar2 ^ 0xffffffff) & uVar3) + x[0xd] + 0x49b40821 + uVar5;
  uVar5 = uVar2 + (uVar5 * 0x400000 | uVar5 >> 10);
  uVar3 = (uVar5 & uVar4 | uVar2 & (uVar4 ^ 0xffffffff)) + local_64 + -0x9e1da9e + uVar3;
  uVar3 = uVar5 + (uVar3 * 0x20 | uVar3 >> 0x1b);
  uVar4 = (uVar3 & uVar2 | uVar5 & (uVar2 ^ 0xffffffff)) + x[4] + -0x3fbf4cc0 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x200 | uVar4 >> 0x17);
  uVar2 = (uVar4 & uVar5 | uVar3 & (uVar5 ^ 0xffffffff)) + x[9] + 0x265e5a51 + uVar2;
  uVar2 = uVar4 + (uVar2 * 0x4000 | uVar2 >> 0x12);
  uVar5 = (uVar2 & uVar3 | uVar4 & (uVar3 ^ 0xffffffff)) + local_68 + -0x16493856 + uVar5;
  uVar5 = uVar2 + (uVar5 * 0x100000 | uVar5 >> 0xc);
  uVar3 = (uVar5 & uVar4 | uVar2 & (uVar4 ^ 0xffffffff)) + x[3] + -0x29d0efa3 + uVar3;
  uVar3 = uVar5 + (uVar3 * 0x20 | uVar3 >> 0x1b);
  uVar4 = (uVar3 & uVar2 | uVar5 & (uVar2 ^ 0xffffffff)) + x[8] + 0x2441453 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x200 | uVar4 >> 0x17);
  uVar2 = (uVar4 & uVar5 | uVar3 & (uVar5 ^ 0xffffffff)) + x[0xd] + -0x275e197f + uVar2;
  uVar2 = uVar4 + (uVar2 * 0x4000 | uVar2 >> 0x12);
  uVar5 = (uVar2 & uVar3 | uVar4 & (uVar3 ^ 0xffffffff)) + x[2] + -0x182c0438 + uVar5;
  uVar5 = uVar2 + (uVar5 * 0x100000 | uVar5 >> 0xc);
  uVar3 = (uVar5 & uVar4 | uVar2 & (uVar4 ^ 0xffffffff)) + x[7] + 0x21e1cde6 + uVar3;
  uVar3 = uVar5 + (uVar3 * 0x20 | uVar3 >> 0x1b);
  uVar4 = (uVar3 & uVar2 | uVar5 & (uVar2 ^ 0xffffffff)) + x[0xc] + -0x3cc8f82a + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x200 | uVar4 >> 0x17);
  uVar2 = (uVar4 & uVar5 | uVar3 & (uVar5 ^ 0xffffffff)) + x[1] + -0xb2af279 + uVar2;
  uVar2 = uVar4 + (uVar2 * 0x4000 | uVar2 >> 0x12);
  uVar5 = (uVar2 & uVar3 | uVar4 & (uVar3 ^ 0xffffffff)) + x[6] + 0x455a14ed + uVar5;
  uVar5 = uVar2 + (uVar5 * 0x100000 | uVar5 >> 0xc);
  uVar3 = (uVar5 & uVar4 | uVar2 & (uVar4 ^ 0xffffffff)) + x[0xb] + -0x561c16fb + uVar3;
  uVar3 = uVar5 + (uVar3 * 0x20 | uVar3 >> 0x1b);
  uVar4 = (uVar3 & uVar2 | uVar5 & (uVar2 ^ 0xffffffff)) + x[0] + -0x3105c08 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x200 | uVar4 >> 0x17);
  uVar2 = (uVar4 & uVar5 | uVar3 & (uVar5 ^ 0xffffffff)) + x[5] + 0x676f02d9 + uVar2;
  uVar2 = uVar4 + (uVar2 * 0x4000 | uVar2 >> 0x12);
  uVar5 = (uVar2 & uVar3 | uVar4 & (uVar3 ^ 0xffffffff)) + x[10] + -0x72d5b376 + uVar5;
  uVar5 = uVar2 + (uVar5 * 0x100000 | uVar5 >> 0xc);
  uVar3 = (uVar5 ^ uVar2 ^ uVar4) + x[3] + -0x5c6be + uVar3;
  uVar3 = uVar5 + (uVar3 * 0x10 | uVar3 >> 0x1c);
  uVar4 = (uVar3 ^ uVar5 ^ uVar2) + x[6] + -0x788e097f + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x800 | uVar4 >> 0x15);
  uVar2 = (uVar4 ^ uVar3 ^ uVar5) + x[9] + 0x6d9d6122 + uVar2;
  uVar2 = uVar4 + (uVar2 * 0x10000 | uVar2 >> 0x10);
  uVar5 = (uVar2 ^ uVar4 ^ uVar3) + x[0xc] + -0x21ac7f4 + uVar5;
  uVar5 = uVar2 + (uVar5 * 0x800000 | uVar5 >> 9);
  uVar3 = (uVar5 ^ uVar2 ^ uVar4) + local_64 + -0x5b4115bc + uVar3;
  uVar3 = uVar5 + (uVar3 * 0x10 | uVar3 >> 0x1c);
  uVar4 = (uVar3 ^ uVar5 ^ uVar2) + x[2] + 0x4bdecfa9 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x800 | uVar4 >> 0x15);
  uVar2 = (uVar4 ^ uVar3 ^ uVar5) + x[5] + -0x944b4a0 + uVar2;
  uVar2 = uVar4 + (uVar2 * 0x10000 | uVar2 >> 0x10);
  uVar5 = (uVar2 ^ uVar4 ^ uVar3) + x[8] + -0x41404390 + uVar5;
  uVar5 = uVar2 + (uVar5 * 0x800000 | uVar5 >> 9);
  uVar3 = (uVar5 ^ uVar2 ^ uVar4) + x[0xb] + 0x289b7ec6 + uVar3;
  uVar3 = uVar5 + (uVar3 * 0x10 | uVar3 >> 0x1c);
  uVar4 = (uVar3 ^ uVar5 ^ uVar2) + local_68 + -0x155ed806 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x800 | uVar4 >> 0x15);
  uVar2 = (uVar4 ^ uVar3 ^ uVar5) + x[1] + -0x2b10cf7b + uVar2;
  uVar2 = uVar4 + (uVar2 * 0x10000 | uVar2 >> 0x10);
  uVar5 = (uVar2 ^ uVar4 ^ uVar3) + x[4] + 0x4881d05 + uVar5;
  uVar5 = uVar2 + (uVar5 * 0x800000 | uVar5 >> 9);
  uVar3 = (uVar5 ^ uVar2 ^ uVar4) + x[7] + -0x262b2fc7 + uVar3;
  uVar3 = uVar5 + (uVar3 * 0x10 | uVar3 >> 0x1c);
  uVar4 = (uVar3 ^ uVar5 ^ uVar2) + x[10] + -0x1924661b + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x800 | uVar4 >> 0x15);
  uVar2 = (uVar4 ^ uVar3 ^ uVar5) + x[0xd] + 0x1fa27cf8 + uVar2;
  uVar2 = uVar4 + (uVar2 * 0x10000 | uVar2 >> 0x10);
  uVar5 = (uVar2 ^ uVar4 ^ uVar3) + x[0] + -0x3b53a99b + uVar5;
  uVar5 = uVar2 + (uVar5 * 0x800000 | uVar5 >> 9);
  uVar3 = (uVar2 ^ (uVar5 | uVar4 ^ 0xffffffff)) + local_68 + -0xbd6ddbc + uVar3;
  uVar3 = uVar5 + (uVar3 * 0x40 | uVar3 >> 0x1a);
  uVar4 = (uVar5 ^ (uVar3 | uVar2 ^ 0xffffffff)) + x[5] + 0x432aff97 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x400 | uVar4 >> 0x16);
  uVar2 = (uVar3 ^ (uVar4 | uVar5 ^ 0xffffffff)) + x[0xc] + -0x546bdc59 + uVar2;
  uVar2 = uVar4 + (uVar2 * 0x8000 | uVar2 >> 0x11);
  uVar5 = (uVar4 ^ (uVar2 | uVar3 ^ 0xffffffff)) + x[3] + -0x36c5fc7 + uVar5;
  uVar5 = uVar2 + (uVar5 * 0x200000 | uVar5 >> 0xb);
  uVar3 = (uVar2 ^ (uVar5 | uVar4 ^ 0xffffffff)) + x[10] + 0x655b59c3 + uVar3;
  uVar3 = uVar5 + (uVar3 * 0x40 | uVar3 >> 0x1a);
  uVar4 = (uVar5 ^ (uVar3 | uVar2 ^ 0xffffffff)) + x[1] + -0x70f3336e + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x400 | uVar4 >> 0x16);
  uVar2 = (uVar3 ^ (uVar4 | uVar5 ^ 0xffffffff)) + x[8] + -0x100b83 + uVar2;
  uVar2 = uVar4 + (uVar2 * 0x8000 | uVar2 >> 0x11);
  uVar5 = (uVar4 ^ (uVar2 | uVar3 ^ 0xffffffff)) + local_64 + -0x7a7ba22f + uVar5;
  uVar5 = uVar2 + (uVar5 * 0x200000 | uVar5 >> 0xb);
  uVar3 = (uVar2 ^ (uVar5 | uVar4 ^ 0xffffffff)) + x[6] + 0x6fa87e4f + uVar3;
  uVar3 = uVar5 + (uVar3 * 0x40 | uVar3 >> 0x1a);
  uVar4 = (uVar5 ^ (uVar3 | uVar2 ^ 0xffffffff)) + x[0xd] + -0x1d31920 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x400 | uVar4 >> 0x16);
  uVar2 = (uVar3 ^ (uVar4 | uVar5 ^ 0xffffffff)) + x[4] + -0x5cfebcec + uVar2;
  uVar2 = uVar4 + (uVar2 * 0x8000 | uVar2 >> 0x11);
  uVar5 = (uVar4 ^ (uVar2 | uVar3 ^ 0xffffffff)) + x[0xb] + 0x4e0811a1 + uVar5;
  uVar6 = uVar2 + (uVar5 * 0x200000 | uVar5 >> 0xb);
  uVar3 = (uVar2 ^ (uVar6 | uVar4 ^ 0xffffffff)) + x[2] + -0x8ac817e + uVar3;
  uVar5 = uVar6 + (uVar3 * 0x40 | uVar3 >> 0x1a);
  uVar4 = (uVar6 ^ (uVar5 | uVar2 ^ 0xffffffff)) + x[9] + -0x42c50dcb + uVar4;
  x[0xe] = uVar5 + (uVar4 * 0x400 | uVar4 >> 0x16);
  uVar2 = (uVar5 ^ (x[0xe] | uVar6 ^ 0xffffffff)) + x[0] + 0x2ad7d2bb + uVar2;
  x[0xf] = x[0xe] + (uVar2 * 0x8000 | uVar2 >> 0x11);
  uVar6 = (x[0xe] ^ (x[0xf] | uVar5 ^ 0xffffffff)) + x[7] + -0x14792c6f + uVar6;
  *state = uVar5 + *state;
  state[1] = x[0xf] + (uVar6 * 0x200000 | uVar6 >> 0xb) + state[1];
  state[2] = x[0xf] + state[2];
  state[3] = x[0xe] + state[3];
  memset(&local_68,0,0x40);
  return;
}

Assistant:

static void MD5Transform(UINT4 state[4],
                         const unsigned char block[64])
{
  UINT4 a = state[0], b = state[1], c = state[2], d = state[3], x[16];

  Decode (x, block, 64);

  /* Round 1 */
  FF (a, b, c, d, x[ 0], S11, 0xd76aa478); /* 1 */
  FF (d, a, b, c, x[ 1], S12, 0xe8c7b756); /* 2 */
  FF (c, d, a, b, x[ 2], S13, 0x242070db); /* 3 */
  FF (b, c, d, a, x[ 3], S14, 0xc1bdceee); /* 4 */
  FF (a, b, c, d, x[ 4], S11, 0xf57c0faf); /* 5 */
  FF (d, a, b, c, x[ 5], S12, 0x4787c62a); /* 6 */
  FF (c, d, a, b, x[ 6], S13, 0xa8304613); /* 7 */
  FF (b, c, d, a, x[ 7], S14, 0xfd469501); /* 8 */
  FF (a, b, c, d, x[ 8], S11, 0x698098d8); /* 9 */
  FF (d, a, b, c, x[ 9], S12, 0x8b44f7af); /* 10 */
  FF (c, d, a, b, x[10], S13, 0xffff5bb1); /* 11 */
  FF (b, c, d, a, x[11], S14, 0x895cd7be); /* 12 */
  FF (a, b, c, d, x[12], S11, 0x6b901122); /* 13 */
  FF (d, a, b, c, x[13], S12, 0xfd987193); /* 14 */
  FF (c, d, a, b, x[14], S13, 0xa679438e); /* 15 */
  FF (b, c, d, a, x[15], S14, 0x49b40821); /* 16 */

 /* Round 2 */
  GG (a, b, c, d, x[ 1], S21, 0xf61e2562); /* 17 */
  GG (d, a, b, c, x[ 6], S22, 0xc040b340); /* 18 */
  GG (c, d, a, b, x[11], S23, 0x265e5a51); /* 19 */
  GG (b, c, d, a, x[ 0], S24, 0xe9b6c7aa); /* 20 */
  GG (a, b, c, d, x[ 5], S21, 0xd62f105d); /* 21 */
  GG (d, a, b, c, x[10], S22,  0x2441453); /* 22 */
  GG (c, d, a, b, x[15], S23, 0xd8a1e681); /* 23 */
  GG (b, c, d, a, x[ 4], S24, 0xe7d3fbc8); /* 24 */
  GG (a, b, c, d, x[ 9], S21, 0x21e1cde6); /* 25 */
  GG (d, a, b, c, x[14], S22, 0xc33707d6); /* 26 */
  GG (c, d, a, b, x[ 3], S23, 0xf4d50d87); /* 27 */
  GG (b, c, d, a, x[ 8], S24, 0x455a14ed); /* 28 */
  GG (a, b, c, d, x[13], S21, 0xa9e3e905); /* 29 */
  GG (d, a, b, c, x[ 2], S22, 0xfcefa3f8); /* 30 */
  GG (c, d, a, b, x[ 7], S23, 0x676f02d9); /* 31 */
  GG (b, c, d, a, x[12], S24, 0x8d2a4c8a); /* 32 */

  /* Round 3 */
  HH (a, b, c, d, x[ 5], S31, 0xfffa3942); /* 33 */
  HH (d, a, b, c, x[ 8], S32, 0x8771f681); /* 34 */
  HH (c, d, a, b, x[11], S33, 0x6d9d6122); /* 35 */
  HH (b, c, d, a, x[14], S34, 0xfde5380c); /* 36 */
  HH (a, b, c, d, x[ 1], S31, 0xa4beea44); /* 37 */
  HH (d, a, b, c, x[ 4], S32, 0x4bdecfa9); /* 38 */
  HH (c, d, a, b, x[ 7], S33, 0xf6bb4b60); /* 39 */
  HH (b, c, d, a, x[10], S34, 0xbebfbc70); /* 40 */
  HH (a, b, c, d, x[13], S31, 0x289b7ec6); /* 41 */
  HH (d, a, b, c, x[ 0], S32, 0xeaa127fa); /* 42 */
  HH (c, d, a, b, x[ 3], S33, 0xd4ef3085); /* 43 */
  HH (b, c, d, a, x[ 6], S34,  0x4881d05); /* 44 */
  HH (a, b, c, d, x[ 9], S31, 0xd9d4d039); /* 45 */
  HH (d, a, b, c, x[12], S32, 0xe6db99e5); /* 46 */
  HH (c, d, a, b, x[15], S33, 0x1fa27cf8); /* 47 */
  HH (b, c, d, a, x[ 2], S34, 0xc4ac5665); /* 48 */

  /* Round 4 */
  II (a, b, c, d, x[ 0], S41, 0xf4292244); /* 49 */
  II (d, a, b, c, x[ 7], S42, 0x432aff97); /* 50 */
  II (c, d, a, b, x[14], S43, 0xab9423a7); /* 51 */
  II (b, c, d, a, x[ 5], S44, 0xfc93a039); /* 52 */
  II (a, b, c, d, x[12], S41, 0x655b59c3); /* 53 */
  II (d, a, b, c, x[ 3], S42, 0x8f0ccc92); /* 54 */
  II (c, d, a, b, x[10], S43, 0xffeff47d); /* 55 */
  II (b, c, d, a, x[ 1], S44, 0x85845dd1); /* 56 */
  II (a, b, c, d, x[ 8], S41, 0x6fa87e4f); /* 57 */
  II (d, a, b, c, x[15], S42, 0xfe2ce6e0); /* 58 */
  II (c, d, a, b, x[ 6], S43, 0xa3014314); /* 59 */
  II (b, c, d, a, x[13], S44, 0x4e0811a1); /* 60 */
  II (a, b, c, d, x[ 4], S41, 0xf7537e82); /* 61 */
  II (d, a, b, c, x[11], S42, 0xbd3af235); /* 62 */
  II (c, d, a, b, x[ 2], S43, 0x2ad7d2bb); /* 63 */
  II (b, c, d, a, x[ 9], S44, 0xeb86d391); /* 64 */

  state[0] += a;
  state[1] += b;
  state[2] += c;
  state[3] += d;

  /* Zeroize sensitive information. */
  memset((void *)x, 0, sizeof (x));
}